

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O2

void __thiscall tcpp::StringInputStream::StringInputStream(StringInputStream *this,string *source)

{
  (this->super_IInputStream)._vptr_IInputStream = (_func_int **)&PTR__StringInputStream_001adc98;
  std::__cxx11::string::string((string *)&this->mSourceStr,(string *)source);
  return;
}

Assistant:

StringInputStream::StringInputStream(const std::string& source) TCPP_NOEXCEPT:
		IInputStream(), mSourceStr(source)
	{
	}